

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int vm_builtin_dump(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pObj_00;
  jx9_value *pObj;
  undefined1 local_40 [4];
  int i;
  SyBlob sDump;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  sDump._24_8_ = apArg;
  SyBlobInit((SyBlob *)local_40,&pCtx->pVm->sAllocator);
  for (pObj._4_4_ = 0; pObj._4_4_ < nArg; pObj._4_4_ = pObj._4_4_ + 1) {
    pObj_00 = *(jx9_value **)(sDump._24_8_ + (long)pObj._4_4_ * 8);
    SyBlobReset((SyBlob *)local_40);
    jx9MemObjDump((SyBlob *)local_40,pObj_00);
    if ((int)sDump.pBlob != 0) {
      jx9_context_output(pCtx,(char *)sDump.pAllocator,(int)sDump.pBlob);
    }
  }
  SyBlobRelease((SyBlob *)local_40);
  return 0;
}

Assistant:

static int vm_builtin_dump(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	SyBlob sDump; /* Generated dump is stored here */
	int i;
	SyBlobInit(&sDump,&pCtx->pVm->sAllocator);
	/* Dump one or more expressions */
	for( i = 0 ; i < nArg ; i++ ){
		jx9_value *pObj = apArg[i];
		/* Reset the working buffer */
		SyBlobReset(&sDump);
		/* Dump the given expression */
		jx9MemObjDump(&sDump,pObj);
		/* Output */
		if( SyBlobLength(&sDump) > 0 ){
			jx9_context_output(pCtx, (const char *)SyBlobData(&sDump), (int)SyBlobLength(&sDump));
		}
	}
	/* Release the working buffer */
	SyBlobRelease(&sDump);
	return SXRET_OK;
}